

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockExpectedCall_callWithUnsignedLongIntegerParameter_Test::
~TEST_MockExpectedCall_callWithUnsignedLongIntegerParameter_Test
          (TEST_MockExpectedCall_callWithUnsignedLongIntegerParameter_Test *this)

{
  TEST_MockExpectedCall_callWithUnsignedLongIntegerParameter_Test *this_local;
  
  ~TEST_MockExpectedCall_callWithUnsignedLongIntegerParameter_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST(MockExpectedCall, callWithUnsignedLongIntegerParameter)
{
    const SimpleString paramName = "paramName";
    unsigned long value = 888;
    call->withParameter(paramName, value);
    STRCMP_EQUAL("unsigned long int", call->getInputParameterType(paramName).asCharString());
    LONGS_EQUAL(value, call->getInputParameter(paramName).getUnsignedLongIntValue());
    CHECK(call->hasInputParameterWithName(paramName));
    STRCMP_CONTAINS("funcName -> unsigned long int paramName: <888 (0x378)>", call->callToString().asCharString());
}